

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::DoesDebugInfoOperandMatchExpectation
               (ValidationState_t *_,
               function<bool_(NonSemanticShaderDebugInfo100Instructions)> *expectation,
               Instruction *inst,uint32_t word_index)

{
  bool bVar1;
  uint32_t id;
  Op opcode;
  NonSemanticShaderDebugInfo100Instructions __args;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar2;
  Instruction *this_00;
  spv_ext_inst_type_t *psVar3;
  Instruction *debug_inst;
  uint32_t word_index_local;
  Instruction *inst_local;
  function<bool_(NonSemanticShaderDebugInfo100Instructions)> *expectation_local;
  ValidationState_t *__local;
  
  this = Instruction::words(inst);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
  if (word_index < sVar2) {
    id = Instruction::word(inst,(ulong)word_index);
    this_00 = ValidationState_t::FindDef(_,id);
    opcode = Instruction::opcode(this_00);
    bVar1 = spvIsExtendedInstruction(opcode);
    if ((bVar1) &&
       (psVar3 = Instruction::ext_inst_type(this_00),
       *psVar3 == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) {
      __args = Instruction::word(this_00,4);
      bVar1 = std::function<bool_(NonSemanticShaderDebugInfo100Instructions)>::operator()
                        (expectation,__args);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DoesDebugInfoOperandMatchExpectation(
    const ValidationState_t& _,
    const std::function<bool(NonSemanticShaderDebugInfo100Instructions)>&
        expectation,
    const Instruction* inst, uint32_t word_index) {
  if (inst->words().size() <= word_index) return false;
  auto* debug_inst = _.FindDef(inst->word(word_index));
  if (!spvIsExtendedInstruction(debug_inst->opcode()) ||
      (debug_inst->ext_inst_type() !=
       SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) ||
      !expectation(
          NonSemanticShaderDebugInfo100Instructions(debug_inst->word(4)))) {
    return false;
  }
  return true;
}